

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O2

int __thiscall libnbt::NBTTagList::remove(NBTTagList *this,char *__filename)

{
  iterator iVar1;
  vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_> *this_00;
  char *pcVar2;
  
  iVar1._M_current =
       (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
       super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  pcVar2 = (char *)((long)(this->super_NBTTagVector<libnbt::NBTBase_*>).array.
                          super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)iVar1._M_current >> 3);
  if (__filename < pcVar2) {
    this_00 = &(this->super_NBTTagVector<libnbt::NBTBase_*>).array;
    if (iVar1._M_current[(long)__filename] != (NBTBase *)0x0) {
      (*iVar1._M_current[(long)__filename]->_vptr_NBTBase[5])();
      iVar1._M_current =
           (this_00->super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>).
           _M_impl.super__Vector_impl_data._M_start;
    }
    iVar1 = std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::erase
                      (this_00,iVar1._M_current + (long)__filename);
  }
  return (int)CONCAT71((int7)((ulong)iVar1._M_current >> 8),__filename < pcVar2);
}

Assistant:

bool NBTTagList::remove(size_t index) {
        if (index < array.size()) {
            delete (array[index]);
            array.erase(array.begin() + index);
            return true;
        }
        return false;
    }